

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

RTPTransmissionInfo * __thiscall
jrtplib::RTPTCPTransmitter::GetTransmissionInfo(RTPTCPTransmitter *this)

{
  RTPMemoryManager *pRVar1;
  RTPTransmissionInfo *pRVar2;
  
  if (this->m_init == true) {
    pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      pRVar2 = (RTPTransmissionInfo *)operator_new(0x10);
    }
    else {
      pRVar2 = (RTPTransmissionInfo *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x10,0x1c);
    }
    pRVar2->protocol = TCPProto;
    pRVar2->_vptr_RTPTransmissionInfo = (_func_int **)&PTR__RTPTransmissionInfo_0013c7a0;
    return pRVar2;
  }
  return (RTPTransmissionInfo *)0x0;
}

Assistant:

RTPTransmissionInfo *RTPTCPTransmitter::GetTransmissionInfo()
{
	if (!m_init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPTCPTransmissionInfo();
	MAINMUTEX_UNLOCK
	return tinf;
}